

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_generic-inl.h
# Opt level: O1

int google::GetStackTrace(void **result,int max_depth,int skip_count)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  void *stack [64];
  undefined8 auStack_218 [64];
  
  iVar1 = backtrace(auStack_218);
  uVar3 = iVar1 - (skip_count + 1);
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  if (max_depth <= (int)uVar2) {
    uVar2 = max_depth;
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      result[uVar4] = (void *)auStack_218[(long)(skip_count + 1) + uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return uVar2;
}

Assistant:

int GetStackTrace(void** result, int max_depth, int skip_count) {
  static const int kStackLength = 64;
  void* stack[kStackLength];
  int size;

  size = backtrace(stack, kStackLength);
  skip_count++;  // we want to skip the current frame as well
  int result_count = size - skip_count;
  if (result_count < 0) {
    result_count = 0;
  }
  if (result_count > max_depth) {
    result_count = max_depth;
  }
  for (int i = 0; i < result_count; i++) {
    result[i] = stack[i + skip_count];
  }

  return result_count;
}